

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock-allocator.h
# Opt level: O2

void __thiscall MockAllocator::MockAllocator(MockAllocator *this)

{
  testing::internal::FunctionMocker<void_*(unsigned_long)>::FunctionMocker
            (&this->gmock1_allocate_38);
  testing::internal::FunctionMocker<void_(void_*,_unsigned_long)>::FunctionMocker
            (&this->gmock2_deallocate_39);
  return;
}

Assistant:

MockAllocator() {}